

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::RepeatedField_CopyConstructCordsWithArena_Test::TestBody
          (RepeatedField_CopyConstructCordsWithArena_Test *this)

{
  bool bVar1;
  char *pcVar2;
  const_reference pCVar3;
  AssertHelper local_1b0;
  Message local_1a8;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_2;
  Message local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_168;
  Message local_160;
  int local_158 [2];
  undefined1 local_150 [8];
  AssertionResult gtest_ar;
  RepeatedType *fields1;
  char mem [16];
  Arena arena;
  Cord local_68 [2];
  string_view local_48;
  Cord local_38;
  undefined1 local_28 [8];
  RepeatedType original;
  InternalVisibilityForTesting token;
  RepeatedField_CopyConstructCordsWithArena_Test *this_local;
  
  original.soo_rep_.field_0.long_rep.capacity._3_1_ = 0;
  RepeatedField<absl::lts_20250127::Cord>::RepeatedField
            ((RepeatedField<absl::lts_20250127::Cord> *)local_28);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,"hello");
  absl::lts_20250127::Cord::Cord(&local_38,local_48);
  RepeatedField<absl::lts_20250127::Cord>::Add
            ((RepeatedField<absl::lts_20250127::Cord> *)local_28,&local_38);
  absl::lts_20250127::Cord::~Cord(&local_38);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             &arena.impl_.first_arena_.cached_blocks_,"world and text to avoid SSO");
  absl::lts_20250127::Cord::Cord(local_68,stack0xffffffffffffff88);
  RepeatedField<absl::lts_20250127::Cord>::Add
            ((RepeatedField<absl::lts_20250127::Cord> *)local_28,local_68);
  absl::lts_20250127::Cord::~Cord(local_68);
  Arena::Arena((Arena *)(mem + 8));
  internal::InternalVisibilityForTesting::operator_cast_to_InternalVisibility
            ((InternalVisibilityForTesting *)((long)&original.soo_rep_.field_0 + 0xf));
  RepeatedField<absl::lts_20250127::Cord>::RepeatedField
            ((RepeatedField<absl::lts_20250127::Cord> *)&fields1,mem + 8,local_28);
  local_158[1] = 2;
  local_158[0] = RepeatedField<absl::lts_20250127::Cord>::size
                           ((RepeatedField<absl::lts_20250127::Cord> *)&fields1);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_150,"2","fields1.size()",local_158 + 1,local_158);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
               ,0x30d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    testing::Message::~Message(&local_160);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    pCVar3 = RepeatedField<absl::lts_20250127::Cord>::Get
                       ((RepeatedField<absl::lts_20250127::Cord> *)&fields1,0);
    testing::internal::EqHelper::Compare<char[6],_absl::lts_20250127::Cord,_nullptr>
              ((EqHelper *)local_180,"\"hello\"","fields1.Get(0)",(char (*) [6])0x1eb200f,pCVar3);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
    if (!bVar1) {
      testing::Message::Message(&local_188);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
                 ,0x30e,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_188);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_188);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
    pCVar3 = RepeatedField<absl::lts_20250127::Cord>::Get
                       ((RepeatedField<absl::lts_20250127::Cord> *)&fields1,1);
    testing::internal::EqHelper::Compare<char[28],_absl::lts_20250127::Cord,_nullptr>
              ((EqHelper *)local_1a0,"\"world and text to avoid SSO\"","fields1.Get(1)",
               (char (*) [28])"world and text to avoid SSO",pCVar3);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
    if (!bVar1) {
      testing::Message::Message(&local_1a8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
      testing::internal::AssertHelper::AssertHelper
                (&local_1b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
                 ,0x30f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
      testing::internal::AssertHelper::~AssertHelper(&local_1b0);
      testing::Message::~Message(&local_1a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
    RepeatedField<absl::lts_20250127::Cord>::~RepeatedField
              ((RepeatedField<absl::lts_20250127::Cord> *)&fields1);
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  Arena::~Arena((Arena *)(mem + 8));
  RepeatedField<absl::lts_20250127::Cord>::~RepeatedField
            ((RepeatedField<absl::lts_20250127::Cord> *)local_28);
  return;
}

Assistant:

TEST(RepeatedField, CopyConstructCordsWithArena) {
  auto token = internal::InternalVisibilityForTesting{};
  using RepeatedType = RepeatedField<absl::Cord>;
  RepeatedType original;
  original.Add(absl::Cord("hello"));
  original.Add(absl::Cord("world and text to avoid SSO"));

  Arena arena;
  alignas(RepeatedType) char mem[sizeof(RepeatedType)];
  RepeatedType& fields1 = *new (mem) RepeatedType(token, &arena, original);
  ASSERT_EQ(2, fields1.size());
  EXPECT_EQ("hello", fields1.Get(0));
  EXPECT_EQ("world and text to avoid SSO", fields1.Get(1));

  // Contract requires dtor to be invoked for absl::Cord
  fields1.~RepeatedType();
}